

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O2

void ssl_calc_finished_tls(mbedtls_ssl_context *ssl,uchar *buf,int from)

{
  char *pcVar1;
  mbedtls_ssl_session *pmVar2;
  uchar padbuf [36];
  mbedtls_md5_context md5;
  mbedtls_sha1_context sha1;
  
  pmVar2 = ssl->session_negotiate;
  if (pmVar2 == (mbedtls_ssl_session *)0x0) {
    pmVar2 = ssl->session;
  }
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
             ,0x12bb,"=> calc  finished tls");
  mbedtls_md5_init(&md5);
  mbedtls_sha1_init(&sha1);
  mbedtls_md5_clone(&md5,&ssl->handshake->fin_md5);
  mbedtls_sha1_clone(&sha1,&ssl->handshake->fin_sha1);
  mbedtls_debug_print_buf
            (ssl,4,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
             ,0x12cb,"finished  md5 state",(uchar *)md5.state,0x10);
  mbedtls_debug_print_buf
            (ssl,4,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
             ,0x12d0,"finished sha1 state",(uchar *)sha1.state,0x14);
  pcVar1 = "server finished";
  if (from == 0) {
    pcVar1 = "client finished";
  }
  mbedtls_md5_finish(&md5,padbuf);
  mbedtls_sha1_finish(&sha1,padbuf + 0x10);
  (*ssl->handshake->tls_prf)(pmVar2->master,0x30,pcVar1,padbuf,0x24,buf,0xc);
  mbedtls_debug_print_buf
            (ssl,3,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
             ,0x12dd,"calc finished result",buf,0xc);
  mbedtls_md5_free(&md5);
  mbedtls_sha1_free(&sha1);
  mbedtls_zeroize(padbuf,0x24);
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
             ,0x12e4,"<= calc  finished");
  return;
}

Assistant:

static void ssl_calc_finished_tls(
                mbedtls_ssl_context *ssl, unsigned char *buf, int from )
{
    int len = 12;
    const char *sender;
    mbedtls_md5_context  md5;
    mbedtls_sha1_context sha1;
    unsigned char padbuf[36];

    mbedtls_ssl_session *session = ssl->session_negotiate;
    if( !session )
        session = ssl->session;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> calc  finished tls" ) );

    mbedtls_md5_init( &md5 );
    mbedtls_sha1_init( &sha1 );

    mbedtls_md5_clone( &md5, &ssl->handshake->fin_md5 );
    mbedtls_sha1_clone( &sha1, &ssl->handshake->fin_sha1 );

    /*
     * TLSv1:
     *   hash = PRF( master, finished_label,
     *               MD5( handshake ) + SHA1( handshake ) )[0..11]
     */

#if !defined(MBEDTLS_MD5_ALT)
    MBEDTLS_SSL_DEBUG_BUF( 4, "finished  md5 state", (unsigned char *)
                    md5.state, sizeof(  md5.state ) );
#endif

#if !defined(MBEDTLS_SHA1_ALT)
    MBEDTLS_SSL_DEBUG_BUF( 4, "finished sha1 state", (unsigned char *)
                   sha1.state, sizeof( sha1.state ) );
#endif

    sender = ( from == MBEDTLS_SSL_IS_CLIENT )
             ? "client finished"
             : "server finished";

    mbedtls_md5_finish(  &md5, padbuf );
    mbedtls_sha1_finish( &sha1, padbuf + 16 );

    ssl->handshake->tls_prf( session->master, 48, sender,
                             padbuf, 36, buf, len );

    MBEDTLS_SSL_DEBUG_BUF( 3, "calc finished result", buf, len );

    mbedtls_md5_free(  &md5  );
    mbedtls_sha1_free( &sha1 );

    mbedtls_zeroize(  padbuf, sizeof(  padbuf ) );

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= calc  finished" ) );
}